

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

bool __thiscall cfd::core::TapBranch::IsFindTapScript(TapBranch *this,Script *tapscript)

{
  bool bVar1;
  reference this_00;
  TapBranch *branch;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *__range2;
  Script *tapscript_local;
  TapBranch *this_local;
  
  if (((this->has_leaf_ & 1U) == 0) || (bVar1 = Script::Equals(&this->script_,tapscript), !bVar1)) {
    __end2 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::begin
                       (&this->branch_list_);
    branch = (TapBranch *)
             ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::end
                       (&this->branch_list_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
                                       *)&branch), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
                ::operator*(&__end2);
      bVar1 = IsFindTapScript(this_00,tapscript);
      if (bVar1) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TapBranch::IsFindTapScript(const Script& tapscript) const {
  if (has_leaf_ && script_.Equals(tapscript)) return true;

  for (const auto& branch : branch_list_) {
    if (branch.IsFindTapScript(tapscript)) return true;
  }
  return false;
}